

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

bool __thiscall libchars::command_cursor::next_root(command_cursor *this)

{
  size_t sVar1;
  size_t sVar2;
  value_type pcVar3;
  bool bVar4;
  ulong uVar5;
  reference ppcVar6;
  ulong uVar7;
  FILE *in_RSI;
  command_node *n;
  command_cursor *this_local;
  
  bVar4 = std::
          stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
          ::empty(&this->S);
  if (bVar4) {
    if (((this->root != (command_node *)0x0) && (this->root->start != (command_node *)0x0)) &&
       (sVar1 = this->root_idx, sVar2 = this->idx, uVar5 = std::__cxx11::string::length(),
       uVar5 <= sVar1 + sVar2)) {
      this->root = this->root->start;
      this->root_idx = 0;
      rewind(this,in_RSI);
      return true;
    }
  }
  else {
    ppcVar6 = std::
              stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
              ::top(&this->S);
    pcVar3 = *ppcVar6;
    if (((pcVar3 != (value_type)0x0) && (pcVar3->start != (command_node *)0x0)) &&
       (uVar5 = this->idx, uVar7 = std::__cxx11::string::length(), uVar7 <= uVar5)) {
      this->root = pcVar3->start;
      this->root_idx = 0;
      rewind(this,in_RSI);
      return true;
    }
  }
  return false;
}

Assistant:

bool command_cursor::next_root()
    {
        if (S.empty()) {
            if (root != NULL && root->start != NULL && (root_idx + idx) >= root->part.length()) {
                root = root->start;
                root_idx = 0;
                rewind();
                return true;
            }
        }
        else {
            command_node *n = S.top();
            if (n != NULL && n->start != NULL && idx >= n->part.length()) {
                root = n->start;
                root_idx = 0;
                rewind();
                return true;
            }
        }
        return false;
    }